

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# effect-handler-attack.c
# Opt level: O0

_Bool effect_handler_AIR_SMITE(effect_handler_context_t *context)

{
  _Bool _Var1;
  wchar_t dam_00;
  uint32_t uVar2;
  monster *pmVar3;
  source sVar4;
  source origin;
  source origin_00;
  source origin_01;
  wchar_t d;
  wchar_t flg;
  loc_conflict grid;
  wchar_t j;
  wchar_t i;
  wchar_t dam;
  effect_handler_context_t *context_local;
  
  dam_00 = effect_calculate_value((effect_handler_context_t_conflict *)context,true);
  _d = (loc_conflict)loc(0,0);
  context->ident = true;
  msg("The powers of Air rain down destruction!");
  grid.y = L'\0';
  do {
    if (L'\a' < grid.y) {
      return true;
    }
    for (grid.x = L'\0'; grid.x < L'\x14'; grid.x = grid.x + L'\x01') {
      uVar2 = Rand_div(3);
      if (grid.x == L'\x13') {
        d = (player->grid).x;
        unique0x00012004 = (player->grid).y;
        break;
      }
      scatter(cave,(loc *)&d,player->grid,uVar2 + L'\x01',true);
      _Var1 = loc_eq((loc)_d,player->grid);
      if (((!_Var1) && (_Var1 = square_ispassable((chunk *)cave,_d), _Var1)) &&
         ((pmVar3 = square_monster((chunk *)cave,_d), pmVar3 != (monster *)0x0 || (L'\x03' < grid.x)
          ))) break;
    }
    uVar2 = Rand_div(3);
    if (uVar2 == 0) {
      sVar4 = source_player();
      origin._4_4_ = 0;
      origin.what = sVar4.what;
      origin.which.trap = sVar4.which.trap;
      project(origin,L'\x01',_d,dam_00,L'\x0f',L'y',L'\0','\0',(object *)0x0);
    }
    else {
      uVar2 = Rand_div(2);
      if (uVar2 == 0) {
        sVar4 = source_player();
        origin_00._4_4_ = 0;
        origin_00.what = sVar4.what;
        origin_00.which.trap = sVar4.which.trap;
        project(origin_00,L'\x01',_d,dam_00,L'\x05',L'y',L'\0','\0',(object *)0x0);
      }
      else {
        sVar4 = source_player();
        origin_01._4_4_ = 0;
        origin_01.what = sVar4.what;
        origin_01.which.trap = sVar4.which.trap;
        project(origin_01,L'\x01',_d,dam_00,L'\x01',L'y',L'\0','\0',(object *)0x0);
      }
    }
    event_signal_pause(EVENT_PAUSE,L'\n');
    grid.y = grid.y + L'\x01';
  } while( true );
}

Assistant:

bool effect_handler_AIR_SMITE(effect_handler_context_t *context)
{
	int dam = effect_calculate_value(context, true);
	int i, j;
	struct loc grid = loc(0, 0);
	int flg = PROJECT_STOP | PROJECT_GRID | PROJECT_ITEM | PROJECT_KILL |
		PROJECT_JUMP;

	context->ident = true;

	/* Due warning. */
	msg("The powers of Air rain down destruction!");

	/* Multiple gravity, light, and electricity balls. */
	for (i = 0; i < 8; i++) {
		/* First, we find the spot. */
		for (j = 0; j < 20; j++) {
			/* Pick a (short) distance. */
			int d = randint1(3);

			/* Admit failure.  Switch to Plan B. */
			if (j == 19) {
				grid = player->grid;
				break;
			}

			/* Pick a location */
			scatter(cave, &grid, player->grid, d, true);

			/* Not on top of the player. */
			if (loc_eq(grid, player->grid)) continue;

			/* Require passable terrain */
			if (!square_ispassable(cave, grid)) continue;

			/* Slight preference for actual monsters. */
			if (square_monster(cave, grid)) {
				break;
			} else if (j > 3) {
				/* Will accept any passable grid after a few tries. */
				break;
			}
		}

		/* Choice of 3 */
		if (one_in_(3)) {
			project(source_player(), 1, grid, dam, PROJ_GRAVITY, flg, 0, 0,
					NULL);
		} else if (one_in_(2)) {
			project(source_player(), 1, grid, dam, PROJ_LIGHT, flg, 0, 0, NULL);
		} else {
			project(source_player(), 1, grid, dam, PROJ_ELEC, flg, 0, 0, NULL);
		}

		/* This is a bombardment.  Make it look like one. */
		event_signal_pause(EVENT_PAUSE, 10);
	}
	return true;
}